

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<long,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToDecadesOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  ValidityMask *ldata_00;
  idx_t iVar3;
  SelectionVector *pSVar4;
  interval_t *piVar5;
  ValidityMask *pVVar6;
  interval_t *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  byte in_R8B;
  char in_R9B;
  uint uVar7;
  interval_t iVar8;
  long *ldata_3;
  interval_t *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  long *ldata_2;
  interval_t *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  long *ldata_1;
  interval_t *result_data_1;
  long *ldata;
  interval_t *result_data;
  Vector *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  ValidityMask *in_stack_fffffffffffffe58;
  long in_stack_fffffffffffffe60;
  optional_idx *in_stack_fffffffffffffe90;
  UnifiedVectorFormat *this;
  SelectionVector *in_stack_fffffffffffffe98;
  idx_t in_stack_fffffffffffffea0;
  interval_t *in_stack_fffffffffffffea8;
  long *in_stack_fffffffffffffeb0;
  undefined1 uVar9;
  void *in_stack_fffffffffffffeb8;
  ValidityMask *in_stack_fffffffffffffec0;
  Vector *pVVar10;
  ValidityMask *in_stack_fffffffffffffec8;
  idx_t in_stack_fffffffffffffed0;
  interval_t *in_stack_fffffffffffffed8;
  long *in_stack_fffffffffffffee0;
  UnifiedVectorFormat local_c8 [72];
  SelectionVector *local_80;
  long *local_78;
  interval_t *local_70;
  Vector *local_68;
  optional_idx local_60;
  ValidityMask *local_58;
  interval_t *local_50;
  undefined8 local_48;
  int64_t local_40;
  long *local_38;
  interval_t *local_30;
  char local_22;
  byte local_21;
  interval_t *local_18;
  Vector *local_10;
  Vector *local_8;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    uVar9 = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
    local_50 = FlatVector::GetData<duckdb::interval_t>((Vector *)0xcaa565);
    pVVar6 = (ValidityMask *)FlatVector::GetData<long>((Vector *)0xcaa57a);
    piVar5 = local_50;
    local_58 = pVVar6;
    ldata_00 = FlatVector::Validity((Vector *)0xcaa5bf);
    FlatVector::Validity((Vector *)0xcaa5d4);
    ExecuteFlat<long,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToDecadesOperator>
              ((long *)ldata_00,local_18,(idx_t)piVar5,pVVar6,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,(bool)uVar9);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0xcaa486);
    local_38 = ConstantVector::GetData<long>((Vector *)0xcaa49b);
    bVar2 = ConstantVector::IsNull((Vector *)0xcaa4b0);
    if (bVar2) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      ConstantVector::Validity(local_10);
      iVar8 = UnaryOperatorWrapper::Operation<duckdb::ToDecadesOperator,long,duckdb::interval_t>
                        (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
      local_48 = iVar8._0_8_;
      local_30->months = (undefined4)local_48;
      local_30->days = local_48._4_4_;
      local_40 = iVar8.micros;
      local_30->micros = local_40;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_60 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe48);
      bVar2 = optional_idx::IsValid(&local_60);
      if ((bVar2) &&
         (iVar3 = optional_idx::GetIndex(in_stack_fffffffffffffe90),
         (interval_t *)(iVar3 * 2) < local_18 || (long)(iVar3 * 2) - (long)local_18 == 0)) {
        local_68 = DictionaryVector::Child((Vector *)0xcaa67c);
        VVar1 = Vector::GetVectorType(local_68);
        if (VVar1 == FLAT_VECTOR) {
          local_70 = FlatVector::GetData<duckdb::interval_t>((Vector *)0xcaa6a6);
          local_78 = FlatVector::GetData<long>((Vector *)0xcaa6bb);
          optional_idx::GetIndex(in_stack_fffffffffffffe90);
          pVVar6 = FlatVector::Validity((Vector *)0xcaa6fc);
          uVar9 = (undefined1)((ulong)pVVar6 >> 0x38);
          FlatVector::Validity((Vector *)0xcaa70e);
          ExecuteFlat<long,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToDecadesOperator>
                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                     in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                     (bool)uVar9);
          local_80 = DictionaryVector::SelVector((Vector *)0xcaa74e);
          pVVar10 = local_10;
          pSVar4 = (SelectionVector *)optional_idx::GetIndex(in_stack_fffffffffffffe90);
          duckdb::Vector::Dictionary(local_10,(ulong)pVVar10,pSVar4,(ulong)local_80);
          return;
        }
      }
    }
    this = local_c8;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,(UnifiedVectorFormat *)local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    piVar5 = FlatVector::GetData<duckdb::interval_t>((Vector *)0xcaa7f6);
    UnifiedVectorFormat::GetData<long>(local_c8);
    pVVar6 = FlatVector::Validity((Vector *)0xcaa86d);
    uVar7 = local_21 & 1;
    ExecuteLoop<long,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToDecadesOperator>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,(ValidityMask *)this,(ValidityMask *)piVar5,
               in_stack_fffffffffffffec0,SUB81((ulong)pVVar6 >> 0x38,0));
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe54,uVar7));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}